

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidPadding(void)

{
  RepeatedField<long> *this;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  PaddingLayerParams *pPVar14;
  BorderAmounts *pBVar15;
  BorderAmounts_EdgeSizes *pBVar16;
  PaddingLayerParams_PaddingConstant *pPVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar21;
  Model m1;
  Result res;
  Model MStack_68;
  Result local_38;
  
  CoreML::Specification::Model::Model(&MStack_68,(Arena *)0x0,false);
  if (MStack_68.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_68.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_68.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_68.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((MStack_68.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019a5ef:
    pRVar20 = &(MStack_68.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_68.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0019a5ef;
    ((MStack_68.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar19);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  this = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar2] = 5;
  this->current_size_ = uVar2 + 1;
  if (MStack_68.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_68.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_68.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_68.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((MStack_68.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019a701:
    pRVar20 = &(MStack_68.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_68.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0019a701;
    ((MStack_68.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"probs",puVar19);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (MStack_68._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_68);
    MStack_68._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(MStack_68.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_68.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_68.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_68.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019a7f1:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_68.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar11);
  }
  else {
    iVar1 = (MStack_68.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0019a7f1;
    (MStack_68.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019a829:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar1 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0019a829;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3cb973);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar13 = pRVar4->elements[iVar1];
      goto LAB_0019a893;
    }
  }
  pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
LAB_0019a893:
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3b872d);
  if (pNVar11->_oneof_case_[0] != 200) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 200;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pPVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PaddingLayerParams>
                        (pAVar21);
    (pNVar11->layer_).padding_ = pPVar14;
  }
  pPVar14 = (pNVar11->layer_).padding_;
  if (pPVar14->paddingamounts_ == (BorderAmounts *)0x0) {
    uVar5 = (pPVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pBVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                        (pAVar21);
    pPVar14->paddingamounts_ = pBVar15;
  }
  pBVar15 = pPVar14->paddingamounts_;
  pRVar4 = (pBVar15->borderamounts_).super_RepeatedPtrFieldBase.rep_;
  if ((pRVar4 == (Rep *)0x0) ||
     (iVar1 = (pBVar15->borderamounts_).super_RepeatedPtrFieldBase.current_size_,
     pRVar4->allocated_size <= iVar1)) {
    pBVar16 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::BorderAmounts_EdgeSizes>
                        ((pBVar15->borderamounts_).super_RepeatedPtrFieldBase.arena_);
    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
              (&(pBVar15->borderamounts_).super_RepeatedPtrFieldBase,pBVar16);
  }
  else {
    (pBVar15->borderamounts_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  }
  if (pPVar14->paddingamounts_ == (BorderAmounts *)0x0) {
    uVar5 = (pPVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pBVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                        (pAVar21);
    pPVar14->paddingamounts_ = pBVar15;
  }
  pBVar15 = pPVar14->paddingamounts_;
  pRVar4 = (pBVar15->borderamounts_).super_RepeatedPtrFieldBase.rep_;
  if ((pRVar4 == (Rep *)0x0) ||
     (iVar1 = (pBVar15->borderamounts_).super_RepeatedPtrFieldBase.current_size_,
     pRVar4->allocated_size <= iVar1)) {
    pBVar16 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::BorderAmounts_EdgeSizes>
                        ((pBVar15->borderamounts_).super_RepeatedPtrFieldBase.arena_);
    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
              (&(pBVar15->borderamounts_).super_RepeatedPtrFieldBase,pBVar16);
  }
  else {
    (pBVar15->borderamounts_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  }
  if (pPVar14->_oneof_case_[0] != 1) {
    CoreML::Specification::PaddingLayerParams::clear_PaddingType(pPVar14);
    pPVar14->_oneof_case_[0] = 1;
    uVar5 = (pPVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pPVar17 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>(pAVar21)
    ;
    (pPVar14->PaddingType_).constant_ = pPVar17;
  }
  CoreML::validate<(MLModelType)500>(&local_38,&MStack_68);
  bVar6 = CoreML::Result::good(&local_38);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xba5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_68);
  return (uint)!bVar6;
}

Assistant:

int testValidPadding() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *paddingLayer = nn->add_layers();
    paddingLayer->add_input("input");
    paddingLayer->add_output("probs");
    auto *params = paddingLayer->mutable_padding();

    // If border amounts set, they need to be set in both directions
    params->mutable_paddingamounts()->add_borderamounts();
    params->mutable_paddingamounts()->add_borderamounts();

    (void)params->mutable_constant();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}